

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O2

void __thiscall
TPZDohrAssembly<std::complex<double>_>::ExtractCoarse
          (TPZDohrAssembly<std::complex<double>_> *this,int isub,
          TPZFMatrix<std::complex<double>_> *global,TPZFMatrix<std::complex<double>_> *local)

{
  TPZVec<int> *pTVar1;
  int iVar2;
  complex<double> *pcVar3;
  int iVar4;
  ulong uVar5;
  ulong row;
  ulong col;
  ulong uVar6;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 uVar7;
  
  pTVar1 = (this->fCoarseEqs).fStore;
  uVar6 = pTVar1[isub].fNElements;
  uVar5 = (global->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
  iVar2 = (int)uVar6;
  iVar4 = (int)uVar5;
  (*(local->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0xd])(local,(long)iVar2,(long)iVar4);
  col = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar2 < 1) {
    uVar6 = col;
  }
  uVar5 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    uVar5 = col;
  }
  for (; col != uVar5; col = col + 1) {
    for (row = 0; uVar6 != row; row = row + 1) {
      (*(global->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(global,(long)pTVar1[isub].fStore[row],col);
      uVar7 = in_XMM1_Qa;
      pcVar3 = TPZFMatrix<std::complex<double>_>::operator()(local,row,col);
      *(undefined8 *)pcVar3->_M_value = extraout_XMM0_Qa;
      *(undefined8 *)(pcVar3->_M_value + 8) = in_XMM1_Qa;
      in_XMM1_Qa = uVar7;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::ExtractCoarse(int isub, const TPZFMatrix<TVar> &global, TPZFMatrix<TVar> &local) const
{
	TPZVec<int> &avec = fCoarseEqs[isub];
	int neq = avec.NElements();
	int ieq;
    int ncols = global.Cols();
	local.Resize(neq,ncols);
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            local(ieq,ic) = global.GetVal(avec[ieq],ic);
        }
    }
}